

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O1

bool __thiscall ON_Brep::IsValidEdgeGeometry(ON_Brep *this,int edge_index,ON_TextLog *text_log)

{
  ON_BrepEdge *pOVar1;
  uint uVar2;
  uint uVar3;
  ON_BrepEdge *pOVar4;
  int iVar5;
  ulong uVar6;
  char *format;
  
  if ((edge_index < 0) ||
     ((this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_count <=
      edge_index)) {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    ON_TextLog::Print(text_log,"brep edge_index = %d (should be >=0 and <%d=brep.m_E.Count() ).\n",
                      (ulong)(uint)edge_index,
                      (ulong)(uint)(this->m_E).super_ON_ObjectArray<ON_BrepEdge>.
                                   super_ON_ClassArray<ON_BrepEdge>.m_count);
    return false;
  }
  pOVar4 = (this->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a;
  pOVar1 = pOVar4 + (uint)edge_index;
  if (pOVar4[(uint)edge_index].m_edge_index == edge_index) {
    uVar2 = pOVar1->m_vi[0];
    uVar3 = pOVar1->m_vi[1];
    iVar5 = (*(pOVar1->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
              _vptr_ON_Object[0x34])(pOVar1);
    if ((char)iVar5 == '\0') {
      if (uVar2 != uVar3) {
        return true;
      }
      if (text_log == (ON_TextLog *)0x0) {
        return false;
      }
      ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
      ON_TextLog::PushIndent(text_log);
      ON_TextLog::Print(text_log,"edge.m_vi[0]=edge.m_vi[1]=%d but edge.IsClosed() is false.\n",
                        (ulong)uVar2);
      goto LAB_0040e6f3;
    }
    if (uVar2 == uVar3) {
      return true;
    }
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
    ON_TextLog::PushIndent(text_log);
    format = "edge.m_vi[]=(%d,%d) but edge.IsClosed() is true\n";
    uVar6 = (ulong)uVar3;
  }
  else {
    if (text_log == (ON_TextLog *)0x0) {
      return false;
    }
    ON_TextLog::Print(text_log,"brep.m_E[%d] edge is not valid.\n",(ulong)(uint)edge_index);
    ON_TextLog::PushIndent(text_log);
    uVar2 = pOVar1->m_edge_index;
    format = "edge.m_edge_index = %d (should be %d).\n";
    uVar6 = (ulong)(uint)edge_index;
  }
  ON_TextLog::Print(text_log,format,(ulong)uVar2,uVar6);
LAB_0040e6f3:
  ON_TextLog::PopIndent(text_log);
  return false;
}

Assistant:

bool
ON_Brep::IsValidEdgeGeometry( int edge_index, ON_TextLog* text_log ) const
{
  if ( edge_index < 0 || edge_index >= m_E.Count() )
  {
    if ( text_log )
      text_log->Print("brep edge_index = %d (should be >=0 and <%d=brep.m_E.Count() ).\n",
                      edge_index, m_E.Count());
    return false;
  }
  const ON_BrepEdge& edge = m_E[edge_index];
  if ( edge.m_edge_index != edge_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
      text_log->PushIndent();
      text_log->Print("edge.m_edge_index = %d (should be %d).\n",
                       edge.m_edge_index, edge_index );
      text_log->PopIndent();
    }
    return false;
  }

  int vi0 = edge.m_vi[0];
  int vi1 = edge.m_vi[1];
  if ( edge.IsClosed() ) 
  {
    if ( vi0 != vi1 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_vi[]=(%d,%d) but edge.IsClosed() is true\n",
                         vi0,vi1);
        text_log->PopIndent();
      }
      return false;
    }
  }
  else {
    if ( vi0 == vi1 )
    {
      if ( text_log )
      {
        text_log->Print("brep.m_E[%d] edge is not valid.\n",edge_index);
        text_log->PushIndent();
        text_log->Print("edge.m_vi[0]=edge.m_vi[1]=%d but edge.IsClosed() is false.\n",
                         vi0);
        text_log->PopIndent();
      }
      return false;
    }
  }

  return true;
}